

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void __thiscall Catch::TestCaseTracking::ITracker::~ITracker(ITracker *this)

{
  pointer pcVar1;
  
  this->_vptr_ITracker = (_func_int **)&PTR__ITracker_0019e060;
  pcVar1 = (this->m_nameAndLocation).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->m_nameAndLocation).name.field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

ITracker::~ITracker() = default;